

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imaxdiv.c
# Opt level: O3

int main(void)

{
  imaxdiv_t iVar1;
  
  iVar1 = imaxdiv(5,2);
  if (iVar1.rem != 1 || iVar1.quot != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/imaxdiv.c, line %d - %s\n"
           ,0x1d,"result.quot == 2 && result.rem == 1");
  }
  iVar1 = imaxdiv(-5,2);
  if (iVar1.rem != -1 || iVar1.quot != -2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/imaxdiv.c, line %d - %s\n"
           ,0x1f,"result.quot == -2 && result.rem == -1");
  }
  iVar1 = imaxdiv(5,-2);
  if (iVar1.rem != 1 || iVar1.quot != -2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/inttypes/imaxdiv.c, line %d - %s\n"
           ,0x21,"result.quot == -2 && result.rem == 1");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    imaxdiv_t result;
    result = imaxdiv( ( intmax_t )5, ( intmax_t )2 );
    TESTCASE( result.quot == 2 && result.rem == 1 );
    result = imaxdiv( ( intmax_t )-5, ( intmax_t )2 );
    TESTCASE( result.quot == -2 && result.rem == -1 );
    result = imaxdiv( ( intmax_t )5, ( intmax_t )-2 );
    TESTCASE( result.quot == -2 && result.rem == 1 );
    TESTCASE( sizeof( result.quot ) == sizeof( intmax_t ) );
    TESTCASE( sizeof( result.rem )  == sizeof( intmax_t ) );
    return TEST_RESULTS;
}